

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O2

void Abc_NtkWriteFlopDependency(Abc_Ntk_t *pNtk,char *pFileName)

{
  char *pcVar1;
  long *plVar2;
  Abc_Obj_t *in_RAX;
  FILE *__stream;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  Abc_Obj_t *pObj;
  
  pObj = in_RAX;
  __stream = fopen(pFileName,"w");
  if (__stream != (FILE *)0x0) {
    pcVar1 = pNtk->pName;
    pcVar3 = Extra_TimeStamp();
    fprintf(__stream,"# Flop dependency for \"%s\" generated by ABC on %s\n",pcVar1,pcVar3);
    fwrite("digraph G {\n",0xc,1,__stream);
    fwrite("  graph [splines=true overlap=false];\n",0x26,1,__stream);
    fwrite("  size = \"7.5,10\";\n",0x13,1,__stream);
    fwrite("  center = true;\n",0x11,1,__stream);
    fwrite("  edge [dir=forward];\n",0x16,1,__stream);
    for (uVar8 = 0; iVar7 = pNtk->vBoxes->nSize, (int)uVar8 < iVar7; uVar8 = uVar8 + 1) {
      pAVar4 = Abc_NtkBox(pNtk,uVar8);
      if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
        pAVar4 = Abc_NtkBox(pNtk,uVar8);
        pObj = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
        plVar2 = (long *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray];
        *(uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8)
                 + 0x40) = uVar8;
        pVVar5 = Abc_NtkNodeSupport(pNtk,&pObj,1);
        iVar7 = 0;
        uVar9 = 0;
        while( true ) {
          if (pVVar5->nSize <= iVar7) break;
          pvVar6 = Vec_PtrEntry(pVVar5,iVar7);
          uVar9 = (ulong)((int)uVar9 + (uint)((*(uint *)((long)pvVar6 + 0x14) & 0xf) == 2));
          iVar7 = iVar7 + 1;
        }
        Vec_PtrFree(pVVar5);
        fprintf(__stream,"  { rank = same; %d [label=\"%d(%d)\"]; }\n",(ulong)uVar8,(ulong)uVar8,
                uVar9);
      }
    }
    for (uVar8 = 0; (int)uVar8 < iVar7; uVar8 = uVar8 + 1) {
      pAVar4 = Abc_NtkBox(pNtk,uVar8);
      if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
        pAVar4 = Abc_NtkBox(pNtk,uVar8);
        pObj = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
        pVVar5 = Abc_NtkNodeSupport(pNtk,&pObj,1);
        for (iVar7 = 0; iVar7 < pVVar5->nSize; iVar7 = iVar7 + 1) {
          pvVar6 = Vec_PtrEntry(pVVar5,iVar7);
          if ((*(uint *)((long)pvVar6 + 0x14) & 0xf) != 2) {
            fprintf(__stream,"  %4d -> %4d\n",(ulong)*(uint *)((long)pvVar6 + 0x40),(ulong)uVar8);
          }
        }
        Vec_PtrFree(pVVar5);
      }
      iVar7 = pNtk->vBoxes->nSize;
    }
    fwrite("}\n",2,1,__stream);
    fclose(__stream);
    return;
  }
  printf("Cannot open input file %s.\n",pFileName);
  return;
}

Assistant:

void Abc_NtkWriteFlopDependency( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj, * pTemp;
    int i, k, Count;
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file %s.\n", pFileName );
        return;
    }
    fprintf( pFile, "# Flop dependency for \"%s\" generated by ABC on %s\n", Abc_NtkName(pNtk), Extra_TimeStamp() );
    fprintf( pFile, "digraph G {\n" );
    fprintf( pFile, "  graph [splines=true overlap=false];\n" );
    fprintf( pFile, "  size = \"7.5,10\";\n" );
    fprintf( pFile, "  center = true;\n" );
//    fprintf( pFile, "  edge [len=3,dir=forward];\n" );
    fprintf( pFile, "  edge [dir=forward];\n" );
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        Abc_ObjFanout0( Abc_ObjFanout0(pObj) )->iTemp = i;
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        Count = 0;
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pTemp, k )
            Count += Abc_ObjIsPi(pTemp);
        Vec_PtrFree( vSupp );
        fprintf( pFile, "  { rank = same; %d [label=\"%d(%d)\"]; }\n", i, i, Count );
    }
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        Count = 0;
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pTemp, k )
            if ( !Abc_ObjIsPi(pTemp) )
                fprintf( pFile, "  %4d -> %4d\n", pTemp->iTemp, i );
        Vec_PtrFree( vSupp );
    }
    fprintf( pFile, "}\n" );
    fclose( pFile );
}